

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O1

void __thiscall
ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_copy_t::inc(data_copy_t *this)

{
  short sVar1;
  short sVar2;
  pointer ppVar3;
  pointer ppVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  
  this->index[this->smaller_one] = this->index[this->smaller_one] + 1;
  ppVar3 = this->arr[0].
           super__Vector_base<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = this->arr[1].
           super__Vector_base<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar1 = ppVar3[this->index[0]].first;
  sVar2 = ppVar4[this->index[1]].first;
  bVar7 = -(sVar1 < sVar2) | 1;
  if ((sVar1 == sVar2) &&
     (uVar5 = ppVar3[this->index[0]].second, uVar6 = ppVar4[this->index[1]].second,
     bVar7 = -(uVar5 < uVar6) | 1, uVar5 == uVar6)) {
    bVar7 = 0;
  }
  this->smaller_one = (uint)('\0' < (char)bVar7);
  return;
}

Assistant:

void inc() {
      index[smaller_one]++;
      if (arr[0][index[0]] <= arr[1][index[1]]) {
        smaller_one = 0;
      }
      else {
        smaller_one = 1;
      }
    }